

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O1

int run_test_tmpdir(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint extraout_EAX;
  size_t sVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  char *unaff_RBX;
  int *piVar8;
  size_t len;
  char tmpdir [1024];
  uint uStack_1398;
  uint uStack_1394;
  undefined1 auStack_1390 [8];
  undefined1 auStack_1388 [90];
  byte bStack_132e;
  undefined1 auStack_1250 [90];
  byte bStack_11f6;
  undefined1 auStack_1118 [848];
  undefined1 *puStack_dc8;
  code *pcStack_dc0;
  undefined1 auStack_db0 [312];
  undefined1 auStack_c78 [312];
  undefined1 auStack_b40 [312];
  undefined1 auStack_a08 [848];
  code *pcStack_6b8;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 auStack_6a0 [312];
  undefined1 auStack_568 [312];
  char *pcStack_430;
  undefined8 local_410;
  char local_408 [1024];
  
  local_410 = 0x400;
  local_408[0] = '\0';
  iVar1 = uv_os_tmpdir();
  if (iVar1 == 0) {
    unaff_RBX = local_408;
    sVar4 = strlen(unaff_RBX);
    if (sVar4 != local_410) goto LAB_00177bc1;
    if (local_410 == 0) goto LAB_00177bc6;
    if (local_408[local_410] != '\0') goto LAB_00177bcb;
    if ((local_410 == 1) || (unaff_RBX[local_410 - 1] != '/')) {
      local_410 = 1;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 != -0x69) goto LAB_00177bd0;
      if (local_410 < 2) goto LAB_00177bd5;
      iVar1 = uv_os_tmpdir(0);
      if (iVar1 != -0x16) goto LAB_00177bda;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 != -0x16) goto LAB_00177bdf;
      local_410 = 0;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_00177be4;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_00177bc1:
    run_test_tmpdir_cold_2();
LAB_00177bc6:
    run_test_tmpdir_cold_10();
LAB_00177bcb:
    run_test_tmpdir_cold_3();
LAB_00177bd0:
    run_test_tmpdir_cold_5();
LAB_00177bd5:
    run_test_tmpdir_cold_6();
LAB_00177bda:
    run_test_tmpdir_cold_7();
LAB_00177bdf:
    run_test_tmpdir_cold_8();
LAB_00177be4:
    run_test_tmpdir_cold_9();
  }
  run_test_tmpdir_cold_4();
  pcStack_6b8 = (code *)0x177c00;
  pcStack_430 = unaff_RBX;
  puVar5 = (undefined1 *)uv_default_loop();
  pcStack_6b8 = (code *)0x177c15;
  uVar2 = open64("/dev/tty",0,0);
  if (-1 < (int)uVar2) {
    piVar8 = (int *)(ulong)uVar2;
    pcStack_6b8 = (code *)0x177c35;
    iVar1 = open64("/dev/tty",1,0);
    if (-1 < iVar1) {
      pcStack_6b8 = (code *)0x177c49;
      iVar3 = uv_guess_handle(0xffffffff);
      if (iVar3 == 0) {
        pcStack_6b8 = (code *)0x177c59;
        iVar3 = uv_guess_handle(piVar8);
        if (iVar3 != 0xe) goto LAB_00177e95;
        pcStack_6b8 = (code *)0x177c69;
        iVar3 = uv_guess_handle(iVar1);
        if (iVar3 != 0xe) goto LAB_00177e9a;
        pcStack_6b8 = (code *)0x177c77;
        uVar6 = uv_default_loop();
        pcStack_6b8 = (code *)0x177c8c;
        iVar3 = uv_tty_init(uVar6,auStack_6a0,uVar2,1);
        if (iVar3 != 0) goto LAB_00177e9f;
        pcStack_6b8 = (code *)0x177c9e;
        iVar3 = uv_is_readable(auStack_6a0);
        if (iVar3 == 0) goto LAB_00177ea4;
        pcStack_6b8 = (code *)0x177cb0;
        iVar3 = uv_is_writable(auStack_6a0);
        if (iVar3 != 0) goto LAB_00177ea9;
        pcStack_6b8 = (code *)0x177cbd;
        uVar6 = uv_default_loop();
        pcStack_6b8 = (code *)0x177cd1;
        iVar1 = uv_tty_init(uVar6,auStack_568,iVar1,0);
        if (iVar1 != 0) goto LAB_00177eae;
        pcStack_6b8 = (code *)0x177ce6;
        iVar1 = uv_is_readable(auStack_568);
        if (iVar1 != 0) goto LAB_00177eb3;
        pcStack_6b8 = (code *)0x177cfb;
        iVar1 = uv_is_writable(auStack_568);
        if (iVar1 == 0) goto LAB_00177eb8;
        pcStack_6b8 = (code *)0x177d1a;
        iVar1 = uv_tty_get_winsize(auStack_568,&uStack_6a4,&uStack_6a8);
        if (iVar1 != 0) goto LAB_00177ebd;
        pcStack_6b8 = (code *)0x177d38;
        printf("width=%d height=%d\n",(ulong)uStack_6a4,(ulong)uStack_6a8);
        if (uStack_6a4 == 0 && uStack_6a8 == 0) {
          pcStack_6b8 = (code *)0x177d4b;
          puVar5 = (undefined1 *)uv_default_loop();
          pcStack_6b8 = (code *)0x177d5f;
          uv_walk(puVar5,close_walk_cb,0);
          pcStack_6b8 = (code *)0x177d69;
          uv_run(puVar5);
          pcStack_6b8 = (code *)0x177d6e;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x177d76;
          iVar1 = uv_loop_close(uVar6);
          piVar8 = (int *)0x1;
          if (iVar1 == 0) goto LAB_00177e81;
          pcStack_6b8 = (code *)0x177d89;
          run_test_tty_cold_18();
          uStack_6a8 = extraout_EAX;
        }
        if ((int)uStack_6a4 < 0xb) goto LAB_00177ec2;
        if ((int)uStack_6a8 < 0xb) goto LAB_00177ec7;
        pcStack_6b8 = (code *)0x177daa;
        iVar1 = uv_tty_set_mode(auStack_6a0);
        if (iVar1 != 0) goto LAB_00177ecc;
        pcStack_6b8 = (code *)0x177dbe;
        iVar1 = uv_tty_set_mode(auStack_6a0);
        if (iVar1 != 0) goto LAB_00177ed1;
        pcStack_6b8 = (code *)0x177dcb;
        piVar8 = __errno_location();
        *piVar8 = 0;
        pcStack_6b8 = (code *)0x177dd9;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_00177ed6;
        pcStack_6b8 = (code *)0x177de6;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_00177edb;
        pcStack_6b8 = (code *)0x177df3;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_00177ee0;
        if (*piVar8 == 0) {
          piVar8 = (int *)0x0;
          pcStack_6b8 = (code *)0x177e14;
          uv_close(auStack_6a0,0);
          pcStack_6b8 = (code *)0x177e23;
          uv_close(auStack_568,0);
          pcStack_6b8 = (code *)0x177e2d;
          uv_run(puVar5,0);
          pcStack_6b8 = (code *)0x177e32;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x177e46;
          uv_walk(uVar6,close_walk_cb,0);
          pcStack_6b8 = (code *)0x177e50;
          uv_run(uVar6,0);
          pcStack_6b8 = (code *)0x177e55;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x177e5d;
          iVar1 = uv_loop_close(uVar6);
          if (iVar1 == 0) goto LAB_00177e81;
          pcStack_6b8 = (code *)0x177e66;
          run_test_tty_cold_17();
          goto LAB_00177e76;
        }
      }
      else {
        pcStack_6b8 = (code *)0x177e95;
        run_test_tty_cold_1();
LAB_00177e95:
        pcStack_6b8 = (code *)0x177e9a;
        run_test_tty_cold_2();
LAB_00177e9a:
        pcStack_6b8 = (code *)0x177e9f;
        run_test_tty_cold_3();
LAB_00177e9f:
        pcStack_6b8 = (code *)0x177ea4;
        run_test_tty_cold_4();
LAB_00177ea4:
        pcStack_6b8 = (code *)0x177ea9;
        run_test_tty_cold_20();
LAB_00177ea9:
        pcStack_6b8 = (code *)0x177eae;
        run_test_tty_cold_5();
LAB_00177eae:
        pcStack_6b8 = (code *)0x177eb3;
        run_test_tty_cold_6();
LAB_00177eb3:
        pcStack_6b8 = (code *)0x177eb8;
        run_test_tty_cold_7();
LAB_00177eb8:
        pcStack_6b8 = (code *)0x177ebd;
        run_test_tty_cold_19();
LAB_00177ebd:
        pcStack_6b8 = (code *)0x177ec2;
        run_test_tty_cold_8();
LAB_00177ec2:
        pcStack_6b8 = (code *)0x177ec7;
        run_test_tty_cold_9();
LAB_00177ec7:
        pcStack_6b8 = (code *)0x177ecc;
        run_test_tty_cold_10();
LAB_00177ecc:
        pcStack_6b8 = (code *)0x177ed1;
        run_test_tty_cold_11();
LAB_00177ed1:
        pcStack_6b8 = (code *)0x177ed6;
        run_test_tty_cold_12();
LAB_00177ed6:
        pcStack_6b8 = (code *)0x177edb;
        run_test_tty_cold_13();
LAB_00177edb:
        pcStack_6b8 = (code *)0x177ee0;
        run_test_tty_cold_14();
LAB_00177ee0:
        pcStack_6b8 = (code *)0x177ee5;
        run_test_tty_cold_15();
      }
      pcStack_6b8 = run_test_tty_file;
      run_test_tty_cold_16();
      pcStack_dc0 = (code *)0x177eff;
      pcStack_6b8 = (code *)puVar5;
      iVar1 = uv_loop_init(auStack_a08);
      if (iVar1 == 0) {
        pcStack_dc0 = (code *)0x177f17;
        uVar2 = open64("test/fixtures/empty_file",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x177f37;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_00178257;
          pcStack_dc0 = (code *)0x177f47;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_00177f4f;
          goto LAB_0017825c;
        }
LAB_00177f4f:
        pcStack_dc0 = (code *)0x177f5f;
        uVar2 = open64("/dev/random",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x177f7f;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_00178261;
          pcStack_dc0 = (code *)0x177f8f;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_00177f97;
          goto LAB_00178266;
        }
LAB_00177f97:
        pcStack_dc0 = (code *)0x177fa7;
        uVar2 = open64("/dev/zero",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x177fc7;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_0017826b;
          pcStack_dc0 = (code *)0x177fd7;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_00177fdf;
          goto LAB_00178270;
        }
LAB_00177fdf:
        pcStack_dc0 = (code *)0x177ff2;
        uVar2 = open64("/dev/tty",2);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x178016;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != 0) goto LAB_00178275;
          pcStack_dc0 = (code *)0x178025;
          iVar1 = close(uVar2);
          if (iVar1 != 0) goto LAB_0017827a;
          pcStack_dc0 = (code *)0x178037;
          iVar1 = uv_is_readable(auStack_db0);
          if (iVar1 == 0) goto LAB_0017827f;
          pcStack_dc0 = (code *)0x178049;
          iVar1 = uv_is_writable(auStack_db0);
          if (iVar1 == 0) goto LAB_00178284;
          puVar5 = auStack_db0;
          pcStack_dc0 = (code *)0x178060;
          uv_close(puVar5);
          pcStack_dc0 = (code *)0x178068;
          iVar1 = uv_is_readable(puVar5);
          if (iVar1 != 0) goto LAB_0017828e;
          pcStack_dc0 = (code *)0x17807a;
          iVar1 = uv_is_writable(auStack_db0);
          if (iVar1 == 0) goto LAB_00178082;
          goto LAB_00178298;
        }
LAB_00178082:
        pcStack_dc0 = (code *)0x178092;
        uVar2 = open64("/dev/tty",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x1780b9;
          iVar1 = uv_tty_init(auStack_a08,auStack_b40,uVar2,1);
          if (iVar1 != 0) goto LAB_00178289;
          pcStack_dc0 = (code *)0x1780c8;
          iVar1 = close(uVar2);
          if (iVar1 != 0) goto LAB_00178293;
          pcStack_dc0 = (code *)0x1780dd;
          iVar1 = uv_is_readable(auStack_b40);
          if (iVar1 == 0) goto LAB_0017829d;
          pcStack_dc0 = (code *)0x1780f2;
          iVar1 = uv_is_writable(auStack_b40);
          if (iVar1 != 0) goto LAB_001782a2;
          puVar5 = auStack_b40;
          pcStack_dc0 = (code *)0x17810c;
          uv_close(puVar5,0);
          pcStack_dc0 = (code *)0x178114;
          iVar1 = uv_is_readable(puVar5);
          if (iVar1 != 0) goto LAB_001782ac;
          pcStack_dc0 = (code *)0x178129;
          iVar1 = uv_is_writable(auStack_b40);
          if (iVar1 == 0) goto LAB_00178131;
          goto LAB_001782b6;
        }
LAB_00178131:
        pcStack_dc0 = (code *)0x178144;
        uVar2 = open64("/dev/tty",1);
        if (uVar2 == 0xffffffff) {
LAB_001781e0:
          pcStack_dc0 = (code *)0x1781ef;
          iVar1 = uv_run(auStack_a08,0);
          if (iVar1 != 0) goto LAB_00178248;
          pcStack_dc0 = (code *)0x178200;
          iVar1 = uv_loop_close(auStack_a08);
          if (iVar1 != 0) goto LAB_0017824d;
          pcStack_dc0 = (code *)0x178209;
          puVar5 = (undefined1 *)uv_default_loop();
          pcStack_dc0 = (code *)0x17821d;
          uv_walk(puVar5,close_walk_cb,0);
          pcStack_dc0 = (code *)0x178227;
          uv_run(puVar5,0);
          pcStack_dc0 = (code *)0x17822c;
          uVar6 = uv_default_loop();
          pcStack_dc0 = (code *)0x178234;
          iVar1 = uv_loop_close(uVar6);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_00178252;
        }
        puVar5 = (undefined1 *)(ulong)uVar2;
        pcStack_dc0 = (code *)0x178168;
        iVar1 = uv_tty_init(auStack_a08,auStack_c78,uVar2,0);
        if (iVar1 != 0) goto LAB_001782a7;
        pcStack_dc0 = (code *)0x178177;
        iVar1 = close(uVar2);
        if (iVar1 != 0) goto LAB_001782b1;
        pcStack_dc0 = (code *)0x17818c;
        iVar1 = uv_is_readable(auStack_c78);
        if (iVar1 != 0) goto LAB_001782bb;
        pcStack_dc0 = (code *)0x1781a1;
        iVar1 = uv_is_writable(auStack_c78);
        if (iVar1 == 0) goto LAB_001782c0;
        puVar5 = auStack_c78;
        pcStack_dc0 = (code *)0x1781bb;
        uv_close(puVar5,0);
        pcStack_dc0 = (code *)0x1781c3;
        iVar1 = uv_is_readable(puVar5);
        if (iVar1 != 0) goto LAB_001782c5;
        pcStack_dc0 = (code *)0x1781d8;
        iVar1 = uv_is_writable(auStack_c78);
        if (iVar1 == 0) goto LAB_001781e0;
      }
      else {
        pcStack_dc0 = (code *)0x178248;
        run_test_tty_file_cold_1();
LAB_00178248:
        pcStack_dc0 = (code *)0x17824d;
        run_test_tty_file_cold_26();
LAB_0017824d:
        pcStack_dc0 = (code *)0x178252;
        run_test_tty_file_cold_27();
LAB_00178252:
        pcStack_dc0 = (code *)0x178257;
        run_test_tty_file_cold_28();
LAB_00178257:
        pcStack_dc0 = (code *)0x17825c;
        run_test_tty_file_cold_2();
LAB_0017825c:
        pcStack_dc0 = (code *)0x178261;
        run_test_tty_file_cold_3();
LAB_00178261:
        pcStack_dc0 = (code *)0x178266;
        run_test_tty_file_cold_4();
LAB_00178266:
        pcStack_dc0 = (code *)0x17826b;
        run_test_tty_file_cold_5();
LAB_0017826b:
        pcStack_dc0 = (code *)0x178270;
        run_test_tty_file_cold_6();
LAB_00178270:
        pcStack_dc0 = (code *)0x178275;
        run_test_tty_file_cold_7();
LAB_00178275:
        pcStack_dc0 = (code *)0x17827a;
        run_test_tty_file_cold_8();
LAB_0017827a:
        pcStack_dc0 = (code *)0x17827f;
        run_test_tty_file_cold_9();
LAB_0017827f:
        pcStack_dc0 = (code *)0x178284;
        run_test_tty_file_cold_13();
LAB_00178284:
        pcStack_dc0 = (code *)0x178289;
        run_test_tty_file_cold_12();
LAB_00178289:
        pcStack_dc0 = (code *)0x17828e;
        run_test_tty_file_cold_14();
LAB_0017828e:
        pcStack_dc0 = (code *)0x178293;
        run_test_tty_file_cold_10();
LAB_00178293:
        pcStack_dc0 = (code *)0x178298;
        run_test_tty_file_cold_15();
LAB_00178298:
        pcStack_dc0 = (code *)0x17829d;
        run_test_tty_file_cold_11();
LAB_0017829d:
        pcStack_dc0 = (code *)0x1782a2;
        run_test_tty_file_cold_19();
LAB_001782a2:
        pcStack_dc0 = (code *)0x1782a7;
        run_test_tty_file_cold_16();
LAB_001782a7:
        pcStack_dc0 = (code *)0x1782ac;
        run_test_tty_file_cold_20();
LAB_001782ac:
        pcStack_dc0 = (code *)0x1782b1;
        run_test_tty_file_cold_17();
LAB_001782b1:
        pcStack_dc0 = (code *)0x1782b6;
        run_test_tty_file_cold_21();
LAB_001782b6:
        pcStack_dc0 = (code *)0x1782bb;
        run_test_tty_file_cold_18();
LAB_001782bb:
        pcStack_dc0 = (code *)0x1782c0;
        run_test_tty_file_cold_22();
LAB_001782c0:
        pcStack_dc0 = (code *)0x1782c5;
        run_test_tty_file_cold_25();
LAB_001782c5:
        pcStack_dc0 = (code *)0x1782ca;
        run_test_tty_file_cold_23();
      }
      pcStack_dc0 = run_test_tty_pty;
      run_test_tty_file_cold_24();
      puVar7 = auStack_1118;
      puStack_dc8 = puVar5;
      pcStack_dc0 = (code *)piVar8;
      iVar1 = uv_loop_init(puVar7);
      if (iVar1 == 0) {
        iVar1 = openpty(&uStack_1394,&uStack_1398,0,0,auStack_1390);
        if (iVar1 != 0) {
          run_test_tty_pty_cold_2();
          return 1;
        }
        puVar7 = auStack_1118;
        iVar1 = uv_tty_init(puVar7,auStack_1388,uStack_1398,0);
        if (iVar1 != 0) goto LAB_00178460;
        puVar7 = auStack_1118;
        iVar1 = uv_tty_init(puVar7,auStack_1250,uStack_1394,0);
        if (iVar1 != 0) goto LAB_00178465;
        puVar7 = auStack_1388;
        iVar1 = uv_is_readable(puVar7);
        if (iVar1 == 0) goto LAB_0017846a;
        puVar7 = auStack_1388;
        iVar1 = uv_is_writable(puVar7);
        if (iVar1 == 0) goto LAB_0017846f;
        puVar7 = auStack_1250;
        iVar1 = uv_is_readable(puVar7);
        if (iVar1 == 0) goto LAB_00178474;
        puVar7 = auStack_1250;
        iVar1 = uv_is_writable(puVar7);
        if (iVar1 == 0) goto LAB_00178479;
        if ((bStack_132e & 0x10) != 0) goto LAB_0017847e;
        if ((bStack_11f6 & 0x10) == 0) goto LAB_00178483;
        puVar7 = (undefined1 *)(ulong)uStack_1398;
        iVar1 = close(uStack_1398);
        if (iVar1 != 0) goto LAB_00178488;
        uv_close(auStack_1388,0);
        puVar7 = (undefined1 *)(ulong)uStack_1394;
        iVar1 = close(uStack_1394);
        if (iVar1 != 0) goto LAB_0017848d;
        uv_close(auStack_1250,0);
        puVar7 = auStack_1118;
        iVar1 = uv_run(puVar7,0);
        if (iVar1 == 0) {
          uVar6 = uv_default_loop();
          uv_walk(uVar6,close_walk_cb,0);
          uv_run(uVar6,0);
          puVar7 = (undefined1 *)uv_default_loop();
          iVar1 = uv_loop_close(puVar7);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_00178497;
        }
      }
      else {
        run_test_tty_pty_cold_1();
LAB_00178460:
        run_test_tty_pty_cold_3();
LAB_00178465:
        run_test_tty_pty_cold_4();
LAB_0017846a:
        run_test_tty_pty_cold_14();
LAB_0017846f:
        run_test_tty_pty_cold_13();
LAB_00178474:
        run_test_tty_pty_cold_12();
LAB_00178479:
        run_test_tty_pty_cold_11();
LAB_0017847e:
        run_test_tty_pty_cold_5();
LAB_00178483:
        run_test_tty_pty_cold_10();
LAB_00178488:
        run_test_tty_pty_cold_6();
LAB_0017848d:
        run_test_tty_pty_cold_7();
      }
      run_test_tty_pty_cold_8();
LAB_00178497:
      run_test_tty_pty_cold_9();
      iVar1 = uv_is_closing();
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = uv_close(puVar7,0);
      return iVar1;
    }
  }
LAB_00177e76:
  pcStack_6b8 = (code *)0x177e7b;
  run_test_tty_cold_21();
  piVar8 = (int *)0x1;
LAB_00177e81:
  return (int)piVar8;
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT(strlen(tmpdir) == 0);
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(tmpdir) == len);
  ASSERT(len > 0);
  ASSERT(tmpdir[len] == '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT(last != '\\');
#else
    ASSERT(last != '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT(r == 0);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT(r == 0);
#endif

  return 0;
}